

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_interface.cpp
# Opt level: O0

void mt32emu_get_rom_info(mt32emu_const_context context,mt32emu_rom_info *rom_info)

{
  ROMInfo *local_38;
  ROMInfo *local_30;
  ROMInfo *pcmROMInfo;
  ROMInfo *controlROMInfo;
  mt32emu_rom_info *rom_info_local;
  mt32emu_const_context context_local;
  
  if (context->controlROMImage == (ROMImage *)0x0) {
    local_30 = (ROMInfo *)0x0;
  }
  else {
    local_30 = MT32Emu::ROMImage::getROMInfo(context->controlROMImage);
  }
  if (context->pcmROMImage == (ROMImage *)0x0) {
    local_38 = (ROMInfo *)0x0;
  }
  else {
    local_38 = MT32Emu::ROMImage::getROMInfo(context->pcmROMImage);
  }
  MT32Emu::fillROMInfo(rom_info,local_30,local_38);
  return;
}

Assistant:

void MT32EMU_C_CALL mt32emu_get_rom_info(mt32emu_const_context context, mt32emu_rom_info *rom_info) {
	const ROMInfo *controlROMInfo = context->controlROMImage == NULL ? NULL : context->controlROMImage->getROMInfo();
	const ROMInfo *pcmROMInfo = context->pcmROMImage == NULL ? NULL : context->pcmROMImage->getROMInfo();
	fillROMInfo(rom_info, controlROMInfo, pcmROMInfo);
}